

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int falsecolor(int argc,char **argv)

{
  char *__s;
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  Allocator AVar9;
  float *pfVar10;
  float afVar11 [2];
  int iVar12;
  size_t sVar13;
  long lVar14;
  Tuple2<pbrt::Point2,_int> resolution;
  ulong uVar15;
  long *plVar16;
  ulong uVar17;
  Point2i p;
  undefined1 auVar18 [16];
  Float FVar19;
  float fVar20;
  undefined1 auVar21 [16];
  float fVar22;
  undefined1 auVar23 [64];
  Float FVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 in_XMM4_Da;
  undefined1 in_register_00001304 [12];
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  span<const_float> values;
  bool plusMinus;
  Float maxValue;
  string outFile;
  string inFile;
  Image outImage;
  ImageAndMetadata im;
  bool local_54d;
  float local_54c;
  undefined1 local_548 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  char **local_518;
  long local_510;
  string local_508;
  Float local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  aligned_storage_t<sizeof(float),_alignof(float)> local_478;
  float fStack_474;
  float afStack_470 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_468;
  string asStack_458 [16];
  undefined8 auStack_448 [2];
  string local_438 [8];
  undefined8 uStack_430;
  long alStack_428 [7];
  undefined8 uStack_3f0;
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_3e8;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  optional<int> oStack_3c8;
  optional<float> oStack_3c0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  aStack_3b8;
  undefined8 uStack_3b0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_3a8;
  ColorEncodingHandle local_370;
  ColorEncodingHandle local_368;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  anon_union_128_1_a7e8d694_for_InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_5
  local_340;
  polymorphic_allocator<unsigned_char> local_2a8;
  uchar *local_2a0;
  size_t local_298;
  size_t local_290;
  polymorphic_allocator<pbrt::Half> local_288;
  Half *local_280;
  size_t local_278;
  size_t local_270;
  polymorphic_allocator<float> local_268;
  float *local_260;
  size_t local_258;
  size_t local_250;
  undefined1 local_248 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  polymorphic_allocator<unsigned_char> local_190;
  uchar *local_188;
  size_t local_180;
  size_t local_178;
  polymorphic_allocator<pbrt::Half> local_170;
  Half *local_168;
  size_t local_160;
  size_t local_158;
  polymorphic_allocator<float> local_150;
  float *local_148;
  size_t local_140;
  size_t local_138;
  bool local_12c;
  bool local_e8;
  bool local_a4;
  bool local_90;
  bool local_84;
  bool local_7c;
  bool local_74;
  bool local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_60;
  
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
  local_54d = false;
  local_54c = -INFINITY;
  local_538._M_string_length = 0;
  local_538.field_2._M_local_buf[0] = '\0';
  local_508._M_string_length = 0;
  local_508.field_2._M_local_buf[0] = '\0';
  local_548._8_8_ = local_548._0_8_;
  local_548._0_8_ = "expecting input image filename.";
  local_518 = argv;
  if (*argv != (char *)0x0) {
    do {
      local_248._0_8_ = &local_238;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"outfile","");
      local_498._M_unused._M_object = (void *)0x0;
      local_498._8_8_ = 0;
      local_480 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                  ::_M_invoke;
      local_488 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                  ::_M_manager;
      bVar6 = pbrt::ParseArg<std::__cxx11::string*>
                        (&local_518,(string *)local_248,&local_538,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_498);
      bVar7 = true;
      if (!bVar6) {
        local_360._0_8_ = local_360 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"plusminus","");
        local_4b8._M_unused._M_object = (void *)0x0;
        local_4b8._8_8_ = 0;
        local_4a0 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                    ::_M_invoke;
        local_4a8 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                    ::_M_manager;
        bVar6 = pbrt::ParseArg<bool*>
                          (&local_518,(string *)local_360,&local_54d,
                           (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                            *)&local_4b8);
        bVar7 = true;
        if (!bVar6) {
          _local_478 = &aStack_468;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"maxValue","");
          local_4d8._M_unused._M_object = (void *)0x0;
          local_4d8._8_8_ = 0;
          local_4c0 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                      ::_M_invoke;
          local_4c8 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1175:24)>
                      ::_M_manager;
          bVar7 = pbrt::ParseArg<float*>
                            (&local_518,(string *)&local_478.__align,&local_54c,
                             (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                              *)&local_4d8);
          if (local_4c8 != (code *)0x0) {
            (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
          }
          if (_local_478 != &aStack_468) {
            operator_delete(_local_478,aStack_468._M_allocated_capacity + 1);
          }
        }
        if (local_4a8 != (code *)0x0) {
          (*local_4a8)(&local_4b8,&local_4b8,__destroy_functor);
        }
        if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
          operator_delete((void *)local_360._0_8_,local_350._M_allocated_capacity + 1);
        }
      }
      if (local_488 != (code *)0x0) {
        (*local_488)(&local_498,&local_498,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_248._0_8_ != &local_238) {
        operator_delete((void *)local_248._0_8_,(long)local_238.alloc.memoryResource + 1);
      }
      if (bVar7 == false) {
        __s = *local_518;
        if ((local_508._M_string_length != 0) || (*__s == '-')) {
          usage("falsecolor","%s: unknown command flag",__s);
        }
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)&local_508,0,(char *)0x0,(ulong)__s);
        local_518 = local_518 + 1;
      }
    } while (*local_518 != (char *)0x0);
    if (local_508._M_string_length != 0) {
      if (local_538._M_string_length != 0) {
        AVar9.memoryResource = pstd::pmr::new_delete_resource();
        local_368.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        pbrt::Image::Read((ImageAndMetadata *)local_248,&local_508,AVar9,&local_368);
        resolution.y = local_248._8_4_;
        resolution.x = local_248._4_4_;
        if ((local_54c <= -INFINITY) && (0 < (int)local_248._8_4_)) {
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_548._8_8_;
          local_548 = auVar18 << 0x40;
          do {
            if (0 < resolution.x) {
              uVar17 = 0;
              uVar15 = local_548._0_8_ << 0x20;
              do {
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)local_360,(Image *)local_248,
                           (Point2i)(uVar15 | uVar17),(WrapMode2D)0x200000002);
                if (local_340.fixed[0]._M_string_length == 0) {
                  auVar18 = SUB6416(ZEXT864(0),0);
                }
                else {
                  fVar22 = 0.0;
                  pfVar10 = (float *)local_360._8_8_;
                  if ((float *)local_360._8_8_ == (float *)0x0) {
                    pfVar10 = (float *)(local_360 + 0x10);
                  }
                  sVar13 = 0;
                  do {
                    fVar22 = fVar22 + pfVar10[sVar13];
                    auVar18 = ZEXT416((uint)fVar22);
                    sVar13 = sVar13 + 1;
                  } while (local_340.fixed[0]._M_string_length != sVar13);
                }
                fVar22 = (float)(long)local_340.fixed[0]._M_string_length;
                local_340.fixed[0]._M_string_length = 0;
                auVar21._0_4_ = auVar18._0_4_ / fVar22;
                auVar21._4_12_ = auVar18._4_12_;
                auVar2._8_4_ = 0x7fffffff;
                auVar2._0_8_ = 0x7fffffff7fffffff;
                auVar2._12_4_ = 0x7fffffff;
                auVar18 = vandps_avx512vl(auVar21,auVar2);
                auVar18 = vmaxss_avx(auVar18,ZEXT416((uint)local_54c));
                local_54c = auVar18._0_4_;
                (**(code **)(*(long *)local_360._0_8_ + 0x18))
                          (local_360._0_8_,local_360._8_8_,
                           (long)local_340.fixed[0]._M_dataplus._M_p << 2,4);
                resolution.y = local_248._8_4_;
                resolution.x = local_248._4_4_;
                uVar17 = uVar17 + 1;
              } while ((long)uVar17 < (long)(int)local_248._4_4_);
            }
            lVar14 = local_548._0_8_ + 1;
            local_548._0_8_ = lVar14;
          } while (lVar14 < (long)resolution >> 0x20);
        }
        _local_478 = &aStack_468;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"R","");
        asStack_458._0_8_ = auStack_448;
        std::__cxx11::string::_M_construct<char_const*>(asStack_458,"G","");
        plVar16 = alStack_428;
        local_438 = (string  [8])plVar16;
        std::__cxx11::string::_M_construct<char_const*>(local_438,"B","");
        local_370.
        super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
        .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                 )0;
        AVar9.memoryResource = pstd::pmr::new_delete_resource();
        channels.n = 3;
        channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_478;
        pbrt::Image::Image((Image *)local_360,Half,(Point2i)resolution,channels,&local_370,AVar9);
        lVar14 = -0x60;
        pIVar5 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_248._0_8_;
        do {
          if (plVar16 != (long *)plVar16[-2]) {
            local_248._0_8_ = pIVar5;
            operator_delete((long *)plVar16[-2],*plVar16 + 1);
            pIVar5 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_248._0_8_;
          }
          local_248._4_4_ = (undefined4)((ulong)pIVar5 >> 0x20);
          plVar16 = plVar16 + -4;
          lVar14 = lVar14 + 0x20;
        } while (lVar14 != 0);
        lVar14 = CONCAT44(local_248._8_4_,local_248._4_4_);
        if (0 < (int)local_248._8_4_) {
          local_510 = 0;
          do {
            if (0 < (int)lVar14) {
              uVar17 = 0;
              uVar15 = local_510 << 0x20;
              local_248._0_8_ = pIVar5;
              do {
                p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(uVar15 | uVar17);
                pbrt::Image::GetChannels
                          ((ImageChannelValues *)&local_478.__align,(Image *)local_248,p,
                           (WrapMode2D)0x200000002);
                if (asStack_458._8_8_ == 0) {
                  auVar18 = SUB6416(ZEXT864(0),0);
                }
                else {
                  fVar22 = 0.0;
                  afVar11 = afStack_470;
                  if (afStack_470 == (float  [2])0x0) {
                    afVar11 = (float  [2])&aStack_468;
                  }
                  lVar14 = 0;
                  do {
                    fVar22 = fVar22 + *(float *)((long)afVar11 + lVar14 * 4);
                    auVar18 = ZEXT416((uint)fVar22);
                    lVar14 = lVar14 + 1;
                  } while (asStack_458._8_8_ != lVar14);
                }
                fVar22 = (float)(long)asStack_458._8_8_;
                asStack_458[8] = (string)0x0;
                asStack_458[9] = (string)0x0;
                asStack_458[10] = (string)0x0;
                asStack_458[0xb] = (string)0x0;
                asStack_458[0xc] = (string)0x0;
                asStack_458[0xd] = (string)0x0;
                asStack_458[0xe] = (string)0x0;
                asStack_458[0xf] = (string)0x0;
                local_548._4_12_ = auVar18._4_12_;
                local_548._0_4_ = (auVar18._0_4_ / fVar22) / local_54c;
                (**(code **)(_local_478->_M_allocated_capacity + 0x18))
                          (_local_478,afStack_470,asStack_458._0_8_ << 2,4);
                if (local_54d == true) {
                  auVar23 = ZEXT1664(local_548);
                  if (local_548._0_4_ <= 0.0) {
                    auVar3._8_4_ = 0x7fffffff;
                    auVar3._0_8_ = 0x7fffffff7fffffff;
                    auVar3._12_4_ = 0x7fffffff;
                    auVar18 = vandps_avx512vl(local_548,auVar3);
                    FVar19 = auVar18._0_4_;
                    auVar23 = ZEXT864(0) << 0x20;
                    FVar24 = 0.0;
                    goto LAB_0023a926;
                  }
                  FVar24 = 0.0;
                  FVar19 = 0.0;
LAB_0023a96b:
                  fVar20 = auVar23._0_4_;
                  fVar22 = FVar19 * 0.07739938;
                  uVar25 = 0;
                  uVar26 = 0;
                  uVar27 = 0;
                }
                else {
                  lVar14 = ((long)falseColorValues.
                                  super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                            (long)falseColorValues.
                                  super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                                  super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
                  auVar18 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),local_548);
                  uVar1 = vcmpss_avx512f(local_548,ZEXT816(0) << 0x40,1);
                  auVar4._4_12_ = in_register_00001304;
                  auVar4._0_4_ = in_XMM4_Da;
                  auVar2 = vcvtusi2ss_avx512f(auVar4,lVar14);
                  iVar8 = (int)lVar14 + -1;
                  iVar12 = (int)((float)((uint)!(bool)((byte)uVar1 & 1) * auVar18._0_4_) *
                                auVar2._0_4_);
                  if (iVar12 <= iVar8) {
                    iVar8 = iVar12;
                  }
                  FVar19 = falseColorValues.
                           super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar8].r;
                  auVar23 = ZEXT464((uint)falseColorValues.
                                          super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>.
                                          _M_impl.super__Vector_impl_data._M_start[iVar8].g);
                  FVar24 = falseColorValues.
                           super__Vector_base<pbrt::RGB,_std::allocator<pbrt::RGB>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar8].b;
LAB_0023a926:
                  if (FVar19 <= 0.04045) goto LAB_0023a96b;
                  local_548 = auVar23._0_16_;
                  uStack_4e4 = 0;
                  uStack_4e0 = 0;
                  uStack_4dc = 0;
                  local_4e8 = FVar24;
                  fVar22 = powf((FVar19 + 0.055) * 0.94786733,2.4);
                  fVar20 = local_548._0_4_;
                  FVar24 = local_4e8;
                  uVar25 = uStack_4e4;
                  uVar26 = uStack_4e0;
                  uVar27 = uStack_4dc;
                }
                _local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)CONCAT44(fStack_474,fVar22);
                if (fVar20 <= 0.04045) {
                  fVar20 = fVar20 * 0.07739938;
                }
                else {
                  local_4e8 = FVar24;
                  uStack_4e4 = uVar25;
                  uStack_4e0 = uVar26;
                  uStack_4dc = uVar27;
                  fVar20 = powf((fVar20 + 0.055) * 0.94786733,2.4);
                  FVar24 = local_4e8;
                }
                _local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)CONCAT44(fVar20,local_478);
                if (FVar24 <= 0.04045) {
                  fVar22 = FVar24 * 0.07739938;
                }
                else {
                  fVar22 = powf((FVar24 + 0.055) * 0.94786733,2.4);
                }
                afStack_470[0] = fVar22;
                values.n = 3;
                values.ptr = (float *)&local_478;
                pbrt::Image::SetChannels((Image *)local_360,p,values);
                lVar14 = CONCAT44(local_248._8_4_,local_248._4_4_);
                uVar17 = uVar17 + 1;
                pIVar5 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_248._0_8_;
              } while ((long)uVar17 < (long)(int)local_248._4_4_);
            }
            local_510 = local_510 + 1;
          } while (local_510 < lVar14 >> 0x20);
        }
        _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_3a8._M_impl.super__Rb_tree_header._M_header;
        aStack_3b8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                      )0x0;
        uStack_3b0 = 0;
        _Stack_3a8._M_impl._0_8_ = 0;
        _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_3a8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        alStack_428[6] = 0;
        uStack_3f0 = 0;
        aStack_3e8._0_8_ = 0;
        aStack_3e8._8_8_ = 0;
        uStack_3d8 = 0;
        local_3d0 = 0;
        oStack_3c8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        oStack_3c8.set = false;
        oStack_3c8._5_3_ = 0;
        oStack_3c0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        oStack_3c0.set = false;
        oStack_3c0._5_3_ = 0;
        local_438[0] = (string)0x0;
        local_438[1] = (string)0x0;
        local_438[2] = (string)0x0;
        local_438[3] = (string)0x0;
        local_438[4] = (string)0x0;
        local_438[5] = (string)0x0;
        local_438[6] = (string)0x0;
        local_438[7] = (string)0x0;
        uStack_430 = 0;
        alStack_428[0] = 0;
        alStack_428[1] = 0;
        alStack_428[2] = 0;
        alStack_428[3] = 0;
        alStack_428[4] = 0;
        alStack_428[5] = 0;
        _local_478 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        afStack_470[0] = 0.0;
        afStack_470[1] = 0.0;
        aStack_468._M_allocated_capacity = 0;
        aStack_468._8_8_ = 0;
        asStack_458[0] = (string)0x0;
        asStack_458[1] = (string)0x0;
        asStack_458[2] = (string)0x0;
        asStack_458[3] = (string)0x0;
        asStack_458[4] = (string)0x0;
        asStack_458[5] = (string)0x0;
        asStack_458[6] = (string)0x0;
        asStack_458[7] = (string)0x0;
        asStack_458[8] = (string)0x0;
        asStack_458[9] = (string)0x0;
        asStack_458[10] = (string)0x0;
        asStack_458[0xb] = (string)0x0;
        asStack_458[0xc] = (string)0x0;
        asStack_458[0xd] = (string)0x0;
        asStack_458[0xe] = (string)0x0;
        asStack_458[0xf] = (string)0x0;
        auStack_448[0] = 0;
        auStack_448[1] = 0;
        _Stack_3a8._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_3a8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_248._0_8_ = pIVar5;
        bVar6 = pbrt::Image::Write((Image *)local_360,&local_538,(ImageMetadata *)&local_478.__align
                                  );
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_3a8);
        local_250 = 0;
        (*(local_268.memoryResource)->_vptr_memory_resource[3])
                  (local_268.memoryResource,local_260,local_258 << 2,4);
        local_270 = 0;
        (*(local_288.memoryResource)->_vptr_memory_resource[3])
                  (local_288.memoryResource,local_280,local_278 * 2,2);
        local_290 = 0;
        (*(local_2a8.memoryResource)->_vptr_memory_resource[3])
                  (local_2a8.memoryResource,local_2a0,local_298,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)(local_360 + 0x10));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&local_60);
        if (local_68 == true) {
          local_68 = false;
        }
        if (local_74 == true) {
          local_74 = false;
        }
        if (local_7c == true) {
          local_7c = false;
        }
        if (local_84 == true) {
          local_84 = false;
        }
        if (local_90 == true) {
          local_90 = false;
        }
        if (local_a4 == true) {
          local_a4 = false;
        }
        if (local_e8 == true) {
          local_e8 = false;
        }
        if (local_12c == true) {
          local_12c = false;
        }
        local_138 = 0;
        (*(local_150.memoryResource)->_vptr_memory_resource[3])
                  (local_150.memoryResource,local_148,local_140 << 2,4);
        local_158 = 0;
        (*(local_170.memoryResource)->_vptr_memory_resource[3])
                  (local_170.memoryResource,local_168,local_160 * 2,2);
        local_178 = 0;
        (*(local_190.memoryResource)->_vptr_memory_resource[3])
                  (local_190.memoryResource,local_188,local_180,1);
        pbrt::
        InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~InlinedVector(&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2) {
          operator_delete(local_508._M_dataplus._M_p,
                          CONCAT71(local_508.field_2._M_allocated_capacity._1_7_,
                                   local_508.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_538._M_dataplus._M_p != &local_538.field_2) {
          operator_delete(local_538._M_dataplus._M_p,
                          CONCAT71(local_538.field_2._M_allocated_capacity._1_7_,
                                   local_538.field_2._M_local_buf[0]) + 1);
        }
        return (int)!bVar6;
      }
      local_548._0_8_ = "expecting --outfile filename.";
    }
  }
  usage("falsecolor",(char *)local_548._0_8_);
}

Assistant:

int falsecolor(int argc, char *argv[]) {
    std::string outFile, inFile;
    bool plusMinus = false;
    Float maxValue = -Infinity;

    while (*argv != nullptr) {
        auto onError = [](const std::string &err) {
            usage("falsecolor", "%s", err.c_str());
            exit(1);
        };

        if (ParseArg(&argv, "outfile", &outFile, onError) ||
            ParseArg(&argv, "plusminus", &plusMinus, onError) ||
            ParseArg(&argv, "maxValue", &maxValue, onError)) {
            // success
        } else if (inFile.empty() && argv[0][0] != '-') {
            inFile = *argv;
            ++argv;
        } else {
            usage("falsecolor", "%s: unknown command flag", *argv);
        }
    }

    if (inFile.empty())
        usage("falsecolor", "expecting input image filename.");
    if (outFile.empty())
        usage("falsecolor", "expecting --outfile filename.");

    ImageAndMetadata im = Image::Read(inFile);
    const Image &image = im.image;

    if (maxValue == -Infinity)
        for (int y = 0; y < image.Resolution().y; ++y)
            for (int x = 0; x < image.Resolution().x; ++x)
                maxValue =
                    std::max(maxValue, std::abs(image.GetChannels({x, y}).Average()));

    Image outImage(PixelFormat::Half, image.Resolution(), {"R", "G", "B"});
    for (int y = 0; y < image.Resolution().y; ++y)
        for (int x = 0; x < image.Resolution().x; ++x) {
            Float relativeValue = image.GetChannels({x, y}).Average() / maxValue;
            RGB rgb;
            if (plusMinus) {
                if (relativeValue > 0)
                    rgb = RGB(0, relativeValue, 0);
                else
                    rgb = RGB(std::abs(relativeValue), 0, 0);
            } else {
                relativeValue = Clamp(relativeValue, 0, 1);
                int index = relativeValue * falseColorValues.size();
                index = std::min<int>(index, falseColorValues.size() - 1);
                rgb = falseColorValues[index];
            }

            outImage.SetChannels({x, y}, {SRGBToLinear(rgb[0]), SRGBToLinear(rgb[1]),
                                          SRGBToLinear(rgb[2])});
        }

    if (!outImage.Write(outFile))
        return 1;

    return 0;
}